

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::LoadableGetStateBlock_x
          (ChElementBeamEuler *this,int block_offset,ChState *mD)

{
  long lVar1;
  double *pdVar2;
  pointer psVar3;
  double *pdVar4;
  element_type *peVar5;
  long lVar6;
  Index index_3;
  Index index_2;
  Index index;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (block_offset < 0) goto LAB_00664076;
  lVar6 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  lVar1 = lVar6 + -3;
  if (lVar1 < block_offset) goto LAB_00664076;
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar5 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pdVar2 = pdVar4 + block_offset;
  uVar7 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00663f00;
  }
  else {
LAB_00663f00:
    uVar9 = 0;
    do {
      pdVar2[uVar9] = *(double *)((long)&peVar5->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (uVar7 < 3) {
    do {
      pdVar2[uVar7] = *(double *)((long)&peVar5->super_ChNodeFEAbase + uVar7 * 8 + 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  uVar7 = (ulong)(uint)block_offset;
  lVar6 = lVar6 + -4;
  if (lVar6 < (long)(uVar7 + 3)) goto LAB_00664076;
  pdVar2 = pdVar4 + uVar7 + 3;
  uVar9 = 4;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 4) {
      uVar9 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00663f73;
  }
  else {
LAB_00663f73:
    uVar10 = 0;
    do {
      pdVar2[uVar10] = *(double *)((long)&peVar5->field_0x38 + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (uVar9 < 4) {
    do {
      pdVar2[uVar9] = *(double *)((long)&peVar5->field_0x38 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
  }
  if (lVar1 < (long)(uVar7 + 7)) goto LAB_00664076;
  peVar5 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar2 = pdVar4 + uVar7 + 7;
  uVar9 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar9 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_00663fe4;
  }
  else {
LAB_00663fe4:
    uVar10 = 0;
    do {
      pdVar2[uVar10] = *(double *)((long)&peVar5->super_ChNodeFEAbase + uVar10 * 8 + 0x20);
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (uVar9 < 3) {
    do {
      pdVar2[uVar9] = *(double *)((long)&peVar5->super_ChNodeFEAbase + uVar9 * 8 + 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  if (lVar6 < (long)(uVar7 + 10)) {
LAB_00664076:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar4 = pdVar4 + uVar7 + 10;
  uVar7 = 4;
  if (((ulong)pdVar4 & 7) == 0) {
    uVar8 = -((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 4) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 == 0) goto LAB_0066405a;
  }
  uVar9 = 0;
  do {
    pdVar4[uVar9] = *(double *)((long)&peVar5->field_0x38 + uVar9 * 8);
    uVar9 = uVar9 + 1;
  } while (uVar7 != uVar9);
LAB_0066405a:
  if (uVar7 < 4) {
    do {
      pdVar4[uVar7] = *(double *)((long)&peVar5->field_0x38 + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  return;
}

Assistant:

void ChElementBeamEuler::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 4) = nodes[0]->GetRot().eigen();

    mD.segment(block_offset + 7, 3) = nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 10, 4) = nodes[1]->GetRot().eigen();
}